

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
vkt::geometry::anon_unknown_0::VaryingOutputCountTestInstance::bindDescriptorSets
          (VaryingOutputCountTestInstance *this,DeviceInterface *vk,VkDevice device,
          Allocator *memAlloc,VkCommandBuffer *cmdBuffer,VkPipelineLayout *pipelineLayout)

{
  deUint32 *this_00;
  deUint64 dVar1;
  VkCommandBuffer pVVar2;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  RefData<vk::Handle<(vk::HandleType)8>_> data_00;
  RefData<vk::Handle<(vk::HandleType)20>_> data_01;
  RefData<vk::Handle<(vk::HandleType)13>_> data_02;
  VkResult result;
  VkFormat VVar3;
  Handle<(vk::HandleType)8> *pHVar4;
  Allocation *pAVar5;
  VkDeviceMemory VVar6;
  VkDeviceSize VVar7;
  void *dst;
  Handle<(vk::HandleType)22> *pHVar8;
  DescriptorSetUpdateBuilder *pDVar9;
  Handle<(vk::HandleType)9> *pHVar10;
  Handle<(vk::HandleType)20> *pHVar11;
  Handle<(vk::HandleType)13> *pHVar12;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *this_01;
  undefined4 uVar13;
  undefined4 uVar14;
  Location local_368;
  VkDescriptorSet local_360;
  DescriptorSetUpdateBuilder local_358;
  deUint64 local_310;
  VkSampler local_308;
  undefined1 local_300 [8];
  VkDescriptorImageInfo descriptorImageInfo;
  RefData<vk::Handle<(vk::HandleType)13>_> local_2c8;
  undefined1 local_2a8 [8];
  VkImageViewCreateInfo viewParams;
  RefData<vk::Handle<(vk::HandleType)20>_> local_238;
  undefined1 auStack_218 [8];
  VkSamplerCreateInfo samplerParams;
  TextureFormat TStack_1b8;
  VkFormat format;
  TextureFormat texFormat;
  Location local_1a8;
  VkDescriptorSet local_1a0;
  DescriptorSetUpdateBuilder local_198;
  deUint64 local_150;
  undefined1 local_148 [8];
  VkDescriptorBufferInfo bufferDescriptorInfo;
  VkMemoryRequirements local_108;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_f0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_e0;
  Move<vk::Handle<(vk::HandleType)8>_> local_c0;
  RefData<vk::Handle<(vk::HandleType)8>_> local_a0;
  undefined1 local_80 [8];
  VkBufferCreateInfo bufferCreateInfo;
  deInt32 emitCount [4];
  VkPipelineLayout *pipelineLayout_local;
  VkCommandBuffer *cmdBuffer_local;
  Allocator *memAlloc_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  VaryingOutputCountTestInstance *this_local;
  
  if (this->m_test == READ_UNIFORM) {
    bufferCreateInfo.pQueueFamilyIndices._0_4_ = 6;
    bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0;
    makeBufferCreateInfo((VkBufferCreateInfo *)local_80,0x10,0x10);
    ::vk::createBuffer(&local_c0,vk,device,(VkBufferCreateInfo *)local_80,
                       (VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_a0,(Move *)&local_c0);
    uVar13 = SUB84(local_a0.deleter.m_deviceIface,0);
    uVar14 = (undefined4)((ulong)local_a0.deleter.m_deviceIface >> 0x20);
    data_00.deleter.m_deviceIface._0_4_ = uVar13;
    data_00.object.m_internal = local_a0.object.m_internal;
    data_00.deleter.m_deviceIface._4_4_ = uVar14;
    data_00.deleter.m_device = local_a0.deleter.m_device;
    data_00.deleter.m_allocator = local_a0.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=(&this->m_buffer,data_00);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_c0);
    pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                       (&(this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    ::vk::getBufferMemoryRequirements(&local_108,vk,device,(VkBuffer)pHVar4->m_internal);
    (*memAlloc->_vptr_Allocator[3])
              (&local_f0,memAlloc,&local_108,(ulong)::vk::MemoryRequirement::HostVisible);
    local_e0 = de::details::MovePtr::operator_cast_to_PtrData(&local_f0,(MovePtr *)memAlloc);
    data._8_4_ = uVar13;
    data.ptr = (Allocation *)local_a0.object.m_internal;
    data._12_4_ = uVar14;
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
              (&this->m_allocation,data);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_f0);
    pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                       (&(this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    dVar1 = pHVar4->m_internal;
    this_01 = &this->m_allocation;
    pAVar5 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
             operator->(&this_01->
                         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    VVar6 = ::vk::Allocation::getMemory(pAVar5);
    pAVar5 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
             operator->(&this_01->
                         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    VVar7 = ::vk::Allocation::getOffset(pAVar5);
    result = (*vk->_vptr_DeviceInterface[0xc])(vk,device,dVar1,VVar6.m_internal,VVar7);
    ::vk::checkResult(result,
                      "vk.bindBufferMemory(device, *m_buffer, m_allocation->getMemory(), m_allocation->getOffset())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0x1b4);
    pAVar5 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
             operator->(&this_01->
                         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    dst = ::vk::Allocation::getHostPtr(pAVar5);
    ::deMemcpy(dst,&bufferCreateInfo.pQueueFamilyIndices,0x10);
    pAVar5 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
             operator->(&this_01->
                         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    bufferDescriptorInfo.range = (VkDeviceSize)::vk::Allocation::getMemory(pAVar5);
    pAVar5 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
             operator->(&this_01->
                         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    VVar7 = ::vk::Allocation::getOffset(pAVar5);
    ::vk::flushMappedMemoryRange(vk,device,(VkDeviceMemory)bufferDescriptorInfo.range,VVar7,0x10);
    pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                       (&(this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    local_150 = pHVar4->m_internal;
    ::vk::makeDescriptorBufferInfo((VkDescriptorBufferInfo *)local_148,(VkBuffer)local_150,0,0x10);
    ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_198);
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                       (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    local_1a0.m_internal = pHVar8->m_internal;
    local_1a8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
    pDVar9 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                       (&local_198,local_1a0,&local_1a8,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                        (VkDescriptorBufferInfo *)local_148);
    ::vk::DescriptorSetUpdateBuilder::update(pDVar9,vk,device);
    ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_198);
    pVVar2 = *cmdBuffer;
    texFormat = (TextureFormat)pipelineLayout->m_internal;
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                       (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    (*vk->_vptr_DeviceInterface[0x56])(vk,pVVar2,0,texFormat,0,1,pHVar8,0,0);
  }
  else if (this->m_test == READ_TEXTURE) {
    TStack_1b8 = glu::mapGLInternalFormat(0x8058);
    VVar3 = ::vk::mapTextureFormat(&stack0xfffffffffffffe48);
    samplerParams.compareEnable = 0;
    samplerParams.compareOp = VK_COMPARE_OP_NEVER;
    samplerParams.minLod = 0.0;
    samplerParams.maxLod = 0.0;
    samplerParams.anisotropyEnable = 0;
    samplerParams.maxAnisotropy = 0.0;
    samplerParams.pNext = (void *)0x0;
    samplerParams.flags = 0;
    samplerParams.magFilter = VK_FILTER_NEAREST;
    samplerParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    samplerParams._4_4_ = 0;
    auStack_218 = (undefined1  [8])0x1f;
    samplerParams.minFilter = 2;
    samplerParams.mipmapMode = VK_SAMPLER_MIPMAP_MODE_LAST;
    samplerParams.addressModeU = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
    samplerParams.addressModeV = VK_SAMPLER_ADDRESS_MODE_REPEAT;
    samplerParams.addressModeW = VK_SAMPLER_ADDRESS_MODE_REPEAT;
    samplerParams.mipLodBias = 1.0;
    this_00 = &viewParams.subresourceRange.layerCount;
    ::vk::createSampler((Move<vk::Handle<(vk::HandleType)20>_> *)this_00,vk,device,
                        (VkSamplerCreateInfo *)auStack_218,(VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_238,(Move *)this_00);
    data_01.deleter.m_deviceIface._0_4_ = (int)local_238.deleter.m_deviceIface;
    data_01.object.m_internal = local_238.object.m_internal;
    data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_238.deleter.m_deviceIface >> 0x20);
    data_01.deleter.m_device = local_238.deleter.m_device;
    data_01.deleter.m_allocator = local_238.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)20>_>::operator=(&this->m_sampler,data_01);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)20>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)20>_> *)&viewParams.subresourceRange.layerCount);
    local_2a8._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
    viewParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    viewParams._4_4_ = 0;
    viewParams.pNext._0_4_ = 0;
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        (&(this->m_texture).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    viewParams._16_8_ = pHVar10->m_internal;
    viewParams.image.m_internal._0_4_ = 1;
    viewParams.image.m_internal._4_4_ = VVar3;
    viewParams._32_16_ = ::vk::makeComponentMappingRGBA();
    viewParams.components.b = VK_COMPONENT_SWIZZLE_ZERO;
    viewParams.components.a = VK_COMPONENT_SWIZZLE_IDENTITY;
    viewParams.subresourceRange.aspectMask = 1;
    viewParams.subresourceRange.baseMipLevel = 0;
    viewParams.subresourceRange.levelCount = 1;
    ::vk::createImageView
              ((Move<vk::Handle<(vk::HandleType)13>_> *)&descriptorImageInfo.imageLayout,vk,device,
               (VkImageViewCreateInfo *)local_2a8,(VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_2c8,(Move *)&descriptorImageInfo.imageLayout);
    data_02.deleter.m_deviceIface._0_4_ = (int)local_2c8.deleter.m_deviceIface;
    data_02.object.m_internal = local_2c8.object.m_internal;
    data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2c8.deleter.m_deviceIface >> 0x20);
    data_02.deleter.m_device = local_2c8.deleter.m_device;
    data_02.deleter.m_allocator = local_2c8.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=(&this->m_imageView,data_02);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)13>_> *)&descriptorImageInfo.imageLayout);
    pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)20>_>::operator*
                        (&(this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>);
    local_308.m_internal = pHVar11->m_internal;
    pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                        (&(this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
    local_310 = pHVar12->m_internal;
    ::vk::makeDescriptorImageInfo
              ((VkDescriptorImageInfo *)local_300,local_308,(VkImageView)local_310,
               VK_IMAGE_LAYOUT_GENERAL);
    ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_358);
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                       (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    local_360.m_internal = pHVar8->m_internal;
    local_368 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
    pDVar9 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                       (&local_358,local_360,&local_368,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,
                        (VkDescriptorImageInfo *)local_300);
    ::vk::DescriptorSetUpdateBuilder::update(pDVar9,vk,device);
    ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_358);
    pVVar2 = *cmdBuffer;
    dVar1 = pipelineLayout->m_internal;
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                       (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    (*vk->_vptr_DeviceInterface[0x56])(vk,pVVar2,0,dVar1,0,1,pHVar8,0,0);
  }
  return;
}

Assistant:

void VaryingOutputCountTestInstance::bindDescriptorSets (const DeviceInterface& vk, const VkDevice device, Allocator& memAlloc,
														 const VkCommandBuffer& cmdBuffer, const VkPipelineLayout& pipelineLayout)
{
	if (m_test == READ_UNIFORM)
	{
		const deInt32				emitCount[4]		= { 6, 0, m_maxEmitCount, 10 };
		const VkBufferCreateInfo	bufferCreateInfo	= makeBufferCreateInfo(sizeof(emitCount), VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT);
		m_buffer										= createBuffer(vk, device, &bufferCreateInfo);
		m_allocation									= memAlloc.allocate(getBufferMemoryRequirements(vk, device, *m_buffer), MemoryRequirement::HostVisible);

		VK_CHECK(vk.bindBufferMemory(device, *m_buffer, m_allocation->getMemory(), m_allocation->getOffset()));
		{
			deMemcpy(m_allocation->getHostPtr(), &emitCount[0], sizeof(emitCount));
			flushMappedMemoryRange(vk, device, m_allocation->getMemory(), m_allocation->getOffset(), sizeof(emitCount));

			const VkDescriptorBufferInfo bufferDescriptorInfo = makeDescriptorBufferInfo(*m_buffer, 0ull, sizeof(emitCount));

			DescriptorSetUpdateBuilder()
				.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &bufferDescriptorInfo)
				.update(vk, device);
			vk.cmdBindDescriptorSets(cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, pipelineLayout, 0u, 1u, &*m_descriptorSet, 0u, DE_NULL);
		}
	}
	else if (m_test == READ_TEXTURE)
	{
		const tcu::TextureFormat	texFormat			= glu::mapGLInternalFormat(GL_RGBA8);
		const VkFormat				format				= mapTextureFormat(texFormat);
		const VkSamplerCreateInfo	samplerParams		=
														{
															VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO,		// VkStructureType			sType;
															DE_NULL,									// const void*				pNext;
															0u,											// VkSamplerCreateFlags		flags;
															VK_FILTER_NEAREST,							// VkFilter					magFilter;
															VK_FILTER_NEAREST,							// VkFilter					minFilter;
															VK_SAMPLER_MIPMAP_MODE_NEAREST,				// VkSamplerMipmapMode		mipmapMode;
															VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,		// VkSamplerAddressMode		addressModeU;
															VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,		// VkSamplerAddressMode		addressModeV;
															VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,		// VkSamplerAddressMode		addressModeW;
															0.0f,										// float					mipLodBias;
															VK_FALSE,									// VkBool32					anisotropyEnable;
															1.0f,										// float					maxAnisotropy;
															false,										// VkBool32					compareEnable;
															VK_COMPARE_OP_NEVER,						// VkCompareOp				compareOp;
															0.0f,										// float					minLod;
															0.0f,										// float					maxLod;
															VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK,	// VkBorderColor			borderColor;
															false										// VkBool32					unnormalizedCoordinates;
														};
		m_sampler										= createSampler(vk, device, &samplerParams);
		const VkImageViewCreateInfo	viewParams			=
														{
															VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,	// VkStructureType			sType;
															NULL,										// const voide*				pNext;
															0u,											// VkImageViewCreateFlags	flags;
															*m_texture,									// VkImage					image;
															VK_IMAGE_VIEW_TYPE_2D,						// VkImageViewType			viewType;
															format,										// VkFormat					format;
															makeComponentMappingRGBA(),					// VkChannelMapping			channels;
															{
																VK_IMAGE_ASPECT_COLOR_BIT,				// VkImageAspectFlags	aspectMask;
																0u,										// deUint32				baseMipLevel;
																1u,										// deUint32				mipLevels;
																0,										// deUint32				baseArraySlice;
																1u										// deUint32				arraySize;
															},											// VkImageSubresourceRange	subresourceRange;
														};
		m_imageView										= createImageView(vk, device, &viewParams);
		const VkDescriptorImageInfo descriptorImageInfo = makeDescriptorImageInfo (*m_sampler, *m_imageView, VK_IMAGE_LAYOUT_GENERAL);
		DescriptorSetUpdateBuilder()
			.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, &descriptorImageInfo)
			.update(vk, device);
		vk.cmdBindDescriptorSets(cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, pipelineLayout, 0u, 1u, &*m_descriptorSet, 0u, DE_NULL);
	}
}